

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

bool __thiscall absl::synchronization_internal::GraphCycles::CheckInvariants(GraphCycles *this)

{
  Rep *pRVar1;
  Node *pNVar2;
  bool bVar3;
  uint uVar4;
  void *ptr;
  ulong uVar5;
  int32_t _cursor;
  int32_t y;
  PointerMap *local_70;
  NodeSet ranks;
  
  pRVar1 = this->rep_;
  anon_unknown_0::NodeSet::NodeSet(&ranks);
  local_70 = &pRVar1->ptrmap_;
  for (uVar5 = 0; uVar5 < (pRVar1->nodes_).size_; uVar5 = uVar5 + 1) {
    pNVar2 = (pRVar1->nodes_).ptr_[uVar5];
    if (pNVar2->masked_ptr != 0xf03a5f7bf03a5f7b) {
      ptr = (void *)(pNVar2->masked_ptr ^ 0xf03a5f7bf03a5f7b);
      uVar4 = anon_unknown_0::PointerMap::Find(local_70,ptr);
      if (uVar5 != uVar4) {
        raw_logging_internal::RawLog
                  (kFatal,"graphcycles.cc",0x183,"Did not find live node in hash table %u %p",
                   uVar5 & 0xffffffff,ptr);
      }
    }
    if (pNVar2->visited == true) {
      raw_logging_internal::RawLog
                (kFatal,"graphcycles.cc",0x186,"Did not clear visited marker on node %u",
                 uVar5 & 0xffffffff);
    }
    bVar3 = anon_unknown_0::NodeSet::insert(&ranks,pNVar2->rank);
    if (!bVar3) {
      raw_logging_internal::RawLog
                (kFatal,"graphcycles.cc",0x189,"Duplicate occurrence of rank %d",
                 (ulong)(uint)pNVar2->rank);
    }
    _cursor = 0;
    while( true ) {
      bVar3 = anon_unknown_0::NodeSet::Next(&pNVar2->out,&_cursor,&y);
      if (!bVar3) break;
      uVar4 = (pRVar1->nodes_).ptr_[(uint)y]->rank;
      if ((int)uVar4 <= pNVar2->rank) {
        raw_logging_internal::RawLog
                  (kFatal,"graphcycles.cc",399,"Edge %u->%d has bad rank assignment %d->%d",
                   uVar5 & 0xffffffff,(ulong)(uint)y,(ulong)(uint)pNVar2->rank,(ulong)uVar4);
      }
    }
  }
  anon_unknown_0::Vec<int>::~Vec(&ranks.table_);
  return true;
}

Assistant:

bool GraphCycles::CheckInvariants() const {
  Rep* r = rep_;
  NodeSet ranks;  // Set of ranks seen so far.
  for (uint32_t x = 0; x < r->nodes_.size(); x++) {
    Node* nx = r->nodes_[x];
    void* ptr = base_internal::UnhidePtr<void>(nx->masked_ptr);
    if (ptr != nullptr && static_cast<uint32_t>(r->ptrmap_.Find(ptr)) != x) {
      ABSL_RAW_LOG(FATAL, "Did not find live node in hash table %u %p", x, ptr);
    }
    if (nx->visited) {
      ABSL_RAW_LOG(FATAL, "Did not clear visited marker on node %u", x);
    }
    if (!ranks.insert(nx->rank)) {
      ABSL_RAW_LOG(FATAL, "Duplicate occurrence of rank %d", nx->rank);
    }
    HASH_FOR_EACH(y, nx->out) {
      Node* ny = r->nodes_[y];
      if (nx->rank >= ny->rank) {
        ABSL_RAW_LOG(FATAL, "Edge %u->%d has bad rank assignment %d->%d", x, y,
                     nx->rank, ny->rank);
      }
    }
  }
  return true;
}